

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::MakeNamedMaterial
          (BasicSceneBuilder *this,string *origName,ParsedParameterVector *params,FileLoc loc)

{
  FileLoc loc_00;
  bool bVar1;
  iterator __a;
  undefined1 uVar2;
  char *in_RDX;
  string *in_RSI;
  RGBColorSpace *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  ParameterDictionary dict;
  string name;
  ParameterDictionary *in_stack_fffffffffffffcd8;
  ParameterDictionary *in_stack_fffffffffffffce0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffce8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffcf0;
  ParameterDictionary *parameters;
  value_type *in_stack_fffffffffffffcf8;
  Tuple2<pbrt::Point2,_float> name_00;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  char (*in_stack_fffffffffffffd10) [18];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ParsedParameterVector *params1;
  ParsedParameterVector *in_stack_fffffffffffffd38;
  ParameterDictionary *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd68;
  SceneEntity *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  BasicScene *in_stack_fffffffffffffdd0;
  string local_180 [32];
  _Base_ptr local_160;
  undefined1 local_158;
  uint local_14c;
  _Self local_148;
  _Self local_140 [29];
  undefined1 local_58 [88];
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0x00000008;
  params1 = (ParsedParameterVector *)local_58;
  std::__cxx11::string::string((string *)params1,in_RSI);
  NormalizeUTF8(in_stack_fffffffffffffd68);
  std::__cxx11::string::~string((string *)local_58);
  if ((in_RDI->w).super_Tuple2<pbrt::Point2,_float>.x == 0.0) {
    ErrorExit<char_const(&)[18]>((FileLoc *)this_00,in_RDX,in_stack_fffffffffffffd10);
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,params1,in_RDI);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffce0->params);
  __a = std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffce8,(key_type *)in_stack_fffffffffffffce0);
  local_140[0]._M_node = __a._M_node;
  local_148._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffcd8);
  bVar1 = std::operator!=(local_140,&local_148);
  if (bVar1) {
    ParserTarget::ErrorExitDeferred<std::__cxx11::string&>
              ((ParserTarget *)in_stack_fffffffffffffcf0,(FileLoc *)in_stack_fffffffffffffce8,
               (char *)in_stack_fffffffffffffce0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcd8);
  }
  else {
    pVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffcf8);
    local_160 = (_Base_ptr)pVar3.first._M_node;
    uVar2 = pVar3.second;
    name_00 = (in_RDI->b).super_Tuple2<pbrt::Point2,_float>;
    local_158 = uVar2;
    std::__cxx11::string::string(local_180,(string *)(local_58 + 0x20));
    parameters = (ParameterDictionary *)&stack0xfffffffffffffdcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_RDX,(allocator<char> *)__a._M_node);
    ParameterDictionary::ParameterDictionary(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    loc_00.filename._M_str = in_RDX;
    loc_00.filename._M_len = (size_t)__a._M_node;
    loc_00._16_8_ = this_00;
    SceneEntity::SceneEntity
              ((SceneEntity *)CONCAT17(uVar2,in_stack_fffffffffffffd00),(string *)name_00,parameters
               ,loc_00);
    BasicScene::AddNamedMaterial
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    SceneEntity::~SceneEntity((SceneEntity *)0x7858a8);
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x7858b5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdcf);
    std::__cxx11::string::~string(local_180);
  }
  local_14c = (uint)bVar1;
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x7858f4);
  std::__cxx11::string::~string((string *)(local_58 + 0x20));
  return;
}

Assistant:

void BasicSceneBuilder::MakeNamedMaterial(const std::string &origName,
                                          ParsedParameterVector params, FileLoc loc) {
    std::string name = NormalizeUTF8(origName);
    VERIFY_WORLD("MakeNamedMaterial");

    ParameterDictionary dict(std::move(params), graphicsState.materialAttributes,
                             graphicsState.colorSpace);

    if (namedMaterialNames.find(name) != namedMaterialNames.end()) {
        ErrorExitDeferred(&loc, "%s: named material redefined.", name);
        return;
    }
    namedMaterialNames.insert(name);

    scene->AddNamedMaterial(name, SceneEntity("", std::move(dict), loc));
}